

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void printsub(Curl_easy *data,int direction,uchar *pointer,size_t length)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uchar uVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *fmt;
  ulong uVar8;
  
  if ((data->set).verbose != true) {
    return;
  }
  pcVar7 = "SENT";
  if (direction == 0x3c) {
    pcVar7 = "RCVD";
  }
  Curl_infof(data,"%s IAC SB ",pcVar7);
  if (length < 3) {
    if (length == 2) {
      pcVar7 = "(Empty suboption?)";
      goto LAB_00121764;
    }
    uVar5 = 0;
  }
  else {
    bVar1 = pointer[length - 2];
    uVar5 = (ulong)bVar1;
    bVar2 = pointer[length - 1];
    if (bVar2 != 0xf0 || bVar1 != 0xff) {
      Curl_infof(data,"(terminated by ");
      if (bVar1 < 0x28) {
        pcVar7 = telnetoptions[uVar5];
LAB_00121558:
        Curl_infof(data,"%s ",pcVar7);
      }
      else {
        if (0xeb < bVar1) {
          pcVar7 = telnetcmds[bVar1 - 0xec];
          goto LAB_00121558;
        }
        Curl_infof(data,"%u ",(ulong)bVar1);
      }
      if (bVar2 < 0x28) {
        pcVar7 = telnetoptions[bVar2];
LAB_001215af:
        Curl_infof(data,"%s",pcVar7);
      }
      else {
        if (0xeb < bVar2) {
          pcVar7 = telnetcmds[bVar2 - 0xec];
          goto LAB_001215af;
        }
        Curl_infof(data,"%d");
      }
      Curl_infof(data,", not IAC SE!) ");
    }
  }
  uVar8 = length - 2;
  uVar6 = (ulong)*pointer;
  if (uVar6 < 0x28) {
    if ((*pointer < 0x28) && ((0x8881000000U >> (uVar6 & 0x3f) & 1) != 0)) {
      pcVar7 = telnetoptions[uVar6];
      fmt = "%s";
    }
    else {
      pcVar7 = telnetoptions[uVar6];
      fmt = "%s (unsupported)";
    }
    Curl_infof(data,fmt,pcVar7);
  }
  else {
    Curl_infof(data,"%d (unknown)",(ulong)pointer[uVar5]);
  }
  uVar4 = *pointer;
  if (uVar4 == '\x1f') {
    if (4 < uVar8) {
      Curl_infof(data,"Width: %d ; Height: %d",
                 (ulong)(ushort)(*(ushort *)(pointer + 1) << 8 | *(ushort *)(pointer + 1) >> 8),
                 (ulong)(ushort)(*(ushort *)(pointer + 3) << 8 | *(ushort *)(pointer + 3) >> 8));
    }
  }
  else {
    if ((ulong)pointer[1] < 4) {
      Curl_infof(data,&DAT_0014fd20 + *(int *)(&DAT_0014fd20 + (ulong)pointer[1] * 4));
      uVar4 = *pointer;
    }
    if ((uVar4 == '\x18') || (uVar4 == '#')) {
      pointer[uVar8] = '\0';
      Curl_infof(data," \"%s\"",pointer + 2);
    }
    else if (uVar4 == '\'') {
      if ((pointer[1] == '\0') && (Curl_infof(data," "), 3 < uVar8)) {
        uVar5 = 3;
        uVar6 = 4;
        do {
          if (pointer[uVar5] == '\x01') {
            pcVar7 = " = ";
LAB_00121720:
            Curl_infof(data,pcVar7);
          }
          else {
            if (pointer[uVar5] == '\0') {
              pcVar7 = ", ";
              goto LAB_00121720;
            }
            Curl_infof(data,"%c");
          }
          bVar3 = uVar6 < uVar8;
          uVar5 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar3);
      }
    }
    else if (2 < uVar8) {
      uVar5 = 2;
      uVar6 = 3;
      do {
        Curl_infof(data," %.2x",(ulong)pointer[uVar5]);
        bVar3 = uVar6 < uVar8;
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar3);
    }
  }
  pcVar7 = "\n";
LAB_00121764:
  Curl_infof(data,pcVar7);
  return;
}

Assistant:

static void printsub(struct Curl_easy *data,
                     int direction,             /* '<' or '>' */
                     unsigned char *pointer,    /* where suboption data is */
                     size_t length)             /* length of suboption data */
{
  if(data->set.verbose) {
    unsigned int i = 0;
    if(direction) {
      infof(data, "%s IAC SB ", (direction == '<')? "RCVD":"SENT");
      if(length >= 3) {
        int j;

        i = pointer[length-2];
        j = pointer[length-1];

        if(i != CURL_IAC || j != CURL_SE) {
          infof(data, "(terminated by ");
          if(CURL_TELOPT_OK(i))
            infof(data, "%s ", CURL_TELOPT(i));
          else if(CURL_TELCMD_OK(i))
            infof(data, "%s ", CURL_TELCMD(i));
          else
            infof(data, "%u ", i);
          if(CURL_TELOPT_OK(j))
            infof(data, "%s", CURL_TELOPT(j));
          else if(CURL_TELCMD_OK(j))
            infof(data, "%s", CURL_TELCMD(j));
          else
            infof(data, "%d", j);
          infof(data, ", not IAC SE!) ");
        }
      }
      length -= 2;
    }
    if(length < 1) {
      infof(data, "(Empty suboption?)");
      return;
    }

    if(CURL_TELOPT_OK(pointer[0])) {
      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
      case CURL_TELOPT_NEW_ENVIRON:
      case CURL_TELOPT_NAWS:
        infof(data, "%s", CURL_TELOPT(pointer[0]));
        break;
      default:
        infof(data, "%s (unsupported)", CURL_TELOPT(pointer[0]));
        break;
      }
    }
    else
      infof(data, "%d (unknown)", pointer[i]);

    switch(pointer[0]) {
    case CURL_TELOPT_NAWS:
      if(length > 4)
        infof(data, "Width: %d ; Height: %d", (pointer[1]<<8) | pointer[2],
              (pointer[3]<<8) | pointer[4]);
      break;
    default:
      switch(pointer[1]) {
      case CURL_TELQUAL_IS:
        infof(data, " IS");
        break;
      case CURL_TELQUAL_SEND:
        infof(data, " SEND");
        break;
      case CURL_TELQUAL_INFO:
        infof(data, " INFO/REPLY");
        break;
      case CURL_TELQUAL_NAME:
        infof(data, " NAME");
        break;
      }

      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
        pointer[length] = 0;
        infof(data, " \"%s\"", &pointer[2]);
        break;
      case CURL_TELOPT_NEW_ENVIRON:
        if(pointer[1] == CURL_TELQUAL_IS) {
          infof(data, " ");
          for(i = 3; i < length; i++) {
            switch(pointer[i]) {
            case CURL_NEW_ENV_VAR:
              infof(data, ", ");
              break;
            case CURL_NEW_ENV_VALUE:
              infof(data, " = ");
              break;
            default:
              infof(data, "%c", pointer[i]);
              break;
            }
          }
        }
        break;
      default:
        for(i = 2; i < length; i++)
          infof(data, " %.2x", pointer[i]);
        break;
      }
    }
    if(direction)
      infof(data, "\n");
  }
}